

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  FILE *pFVar3;
  ulong __n;
  size_t sVar4;
  ulong uVar5;
  undefined4 in_register_0000003c;
  flatcc_table_verifier_descriptor_t *td;
  void *__ptr;
  ulong uVar6;
  uchar *pc;
  void *__dest;
  void *p;
  undefined8 local_48;
  
  td = (flatcc_table_verifier_descriptor_t *)CONCAT44(in_register_0000003c,argc);
  if (argc - 3U < 0xfffffffe) {
    main_cold_4();
    iVar2 = flatcc_verify_field(td,0,0x20,0x10);
    if ((((((((iVar2 == 0) && (iVar2 = flatcc_verify_field(td,1,2,2), iVar2 == 0)) &&
            (iVar2 = flatcc_verify_field(td,2,2,2), iVar2 == 0)) &&
           ((iVar2 = flatcc_verify_string_field(td,3,1), iVar2 == 0 &&
            (iVar2 = flatcc_verify_vector_field(td,5,0,1,1,0xffffffff), iVar2 == 0)))) &&
          ((iVar2 = flatcc_verify_field(td,6,1,1), iVar2 == 0 &&
           ((iVar2 = flatcc_verify_union_field(td,8,0,MyGame_Example_Any_union_verifier), iVar2 == 0
            && (iVar2 = flatcc_verify_vector_field(td,9,0,4,2,0x3fffffff), iVar2 == 0)))))) &&
         (((iVar2 = flatcc_verify_string_vector_field(td,10,0), iVar2 == 0 &&
           ((((iVar2 = flatcc_verify_table_vector_field
                                 (td,0xb,0,MyGame_Example_Monster_verify_table), iVar2 == 0 &&
              (iVar2 = flatcc_verify_table_field(td,0xc,0,MyGame_Example_Monster_verify_table),
              iVar2 == 0)) &&
             (iVar2 = flatcc_verify_table_as_nested_root
                                (td,0xd,0,(char *)0x0,1,MyGame_Example_Monster_verify_table),
             iVar2 == 0)) &&
            (((iVar2 = flatcc_verify_table_field(td,0xe,0,MyGame_Example_Stat_verify_table),
              iVar2 == 0 && (iVar2 = flatcc_verify_field(td,0xf,1,1), iVar2 == 0)) &&
             ((iVar2 = flatcc_verify_field(td,0x10,4,4), iVar2 == 0 &&
              ((iVar2 = flatcc_verify_field(td,0x11,4,4), iVar2 == 0 &&
               (iVar2 = flatcc_verify_field(td,0x12,8,8), iVar2 == 0)))))))))) &&
          (iVar2 = flatcc_verify_field(td,0x13,8,8), iVar2 == 0)))) &&
        ((((iVar2 = flatcc_verify_field(td,0x14,4,4), iVar2 == 0 &&
           (iVar2 = flatcc_verify_field(td,0x15,4,4), iVar2 == 0)) &&
          (iVar2 = flatcc_verify_field(td,0x16,8,8), iVar2 == 0)) &&
         (((iVar2 = flatcc_verify_field(td,0x17,8,8), iVar2 == 0 &&
           (iVar2 = flatcc_verify_vector_field(td,0x18,0,1,1,0xffffffff), iVar2 == 0)) &&
          ((((iVar2 = flatcc_verify_field(td,0x19,4,4), iVar2 == 0 &&
             ((iVar2 = flatcc_verify_field(td,0x1a,4,4), iVar2 == 0 &&
              (iVar2 = flatcc_verify_field(td,0x1b,4,4), iVar2 == 0)))) &&
            (iVar2 = flatcc_verify_string_vector_field(td,0x1c,0), iVar2 == 0)) &&
           ((((iVar2 = flatcc_verify_vector_field(td,0x1d,0,8,4,0x1fffffff), iVar2 == 0 &&
              (iVar2 = flatcc_verify_vector_field(td,0x1e,0,1,1,0xffffffff), iVar2 == 0)) &&
             (iVar2 = flatcc_verify_vector_field(td,0x1f,0,4,2,0x3fffffff), iVar2 == 0)) &&
            ((iVar2 = flatcc_verify_vector_field(td,0x20,0,8,8,0x1fffffff), iVar2 == 0 &&
             (iVar2 = flatcc_verify_vector_field(td,0x21,0,8,8,0x1fffffff), iVar2 == 0))))))))))))
       && (iVar2 = flatcc_verify_table_field(td,0x22,0,MyGame_InParentNamespace_verify_table),
          iVar2 == 0)) {
      iVar2 = flatcc_verify_table_field(td,0x23,0,MyGame_Example_TestBase64_verify_table);
      return iVar2;
    }
    return iVar2;
  }
  if (argc == 2) {
    filename = argv[1];
  }
  pFVar3 = fopen(filename,"rb");
  __n = 0;
  __ptr = (void *)0x0;
  if (pFVar3 != (FILE *)0x0) {
    fseek(pFVar3,0,2);
    __n = ftell(pFVar3);
    uVar6 = 0;
    if ((-1 < (long)__n) && (uVar6 = __n, __n < 0x401)) {
      rewind(pFVar3);
      __ptr = malloc(__n + (__n == 0));
      if (__ptr != (void *)0x0) {
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          sVar4 = fread((void *)((long)__ptr + uVar5),1,__n - uVar5,pFVar3);
          uVar6 = sVar4 + uVar5;
        } while (sVar4 != 0);
        fclose(pFVar3);
        if (__n != uVar5) {
          free(__ptr);
          __ptr = (void *)0x0;
        }
        goto LAB_00102988;
      }
    }
    __n = uVar6;
    fclose(pFVar3);
    __ptr = (void *)0x0;
  }
LAB_00102988:
  local_48 = (void *)0x0;
  iVar2 = posix_memalign((void **)&local_48,0x100,__n + 0xff & 0xffffffffffffff00);
  __dest = local_48;
  if (local_48 != (void *)0x0 && iVar2 != 0) {
    free(local_48);
    __dest = (void *)0x0;
  }
  memcpy(__dest,__ptr,__n);
  free(__ptr);
  pFVar3 = _stderr;
  if (__dest == (void *)0x0) {
    fprintf(_stderr,"could not read binary test file: %s\n",filename);
    return -1;
  }
  fprintf(_stderr,"%s:\n","monsterdata_test.mon");
  if ((uint)__n != 0) {
    uVar6 = 0;
    do {
      if ((uVar6 & 0xf) == 0) {
        if (uVar6 != 0) {
          fprintf(pFVar3,"  |%s|\n",&local_48);
        }
        fprintf(pFVar3,"%08x ",uVar6 & 0xffffffff);
      }
      else if ((uVar6 & 7) == 0) {
        fputc(0x20,pFVar3);
      }
      fprintf(pFVar3," %02x",(ulong)*(byte *)((long)__dest + uVar6));
      cVar1 = *(char *)((long)__dest + uVar6);
      if ((byte)(*(char *)((long)__dest + uVar6) + 0x81U) < 0xa1) {
        cVar1 = '.';
      }
      *(char *)((long)&local_48 + (ulong)((uint)uVar6 & 0xf)) = cVar1;
      *(undefined1 *)((long)&local_48 + (uVar6 & 0xf) + 1) = 0;
      uVar6 = uVar6 + 1;
    } while ((__n & 0xffffffff) != uVar6);
    if (((uint)__n & 0xf) - 9 < 0xfffffff8) {
      if ((__n & 0xf) == 0) goto LAB_00102af4;
    }
    else {
      fputc(0x20,pFVar3);
    }
    main_cold_1();
  }
LAB_00102af4:
  fprintf(pFVar3,"  |%s|\n",&local_48);
  iVar2 = flatcc_verify_table_as_root(__dest,__n,"MONS",MyGame_Example_Monster_verify_table);
  if (iVar2 == 0) {
    iVar2 = flatcc_verify_table_as_root(__dest,__n,"MONS",MyGame_Example_Monster_verify_table);
    if (iVar2 == 0) {
      iVar2 = verify_monster(__dest);
      goto LAB_00102b50;
    }
    main_cold_3();
  }
  else {
    main_cold_2();
  }
  iVar2 = -1;
LAB_00102b50:
  free(__dest);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret;
    size_t size;
    void *buffer, *raw_buffer;

    if (argc != 1 && argc != 2) {
        fprintf(stderr, usage);
        exit(1);
    }
    if (argc == 2) {
        filename = argv[1];
    }

    raw_buffer = readfile(filename, 1024, &size);
    buffer = aligned_alloc(256, align_up(256, size));
    memcpy(buffer, raw_buffer, size);
    free(raw_buffer);

    if (!buffer) {
        fprintf(stderr, "could not read binary test file: %s\n", filename);
        return -1;
    }
    hexdump("monsterdata_test.mon", buffer, size, stderr);
    /*
     * Not automated, but verifying size - 3 fails as expected because the last
     * object in the file is a string, and the zero termination fails.
     * size - 1 and size - 2 verifies because the buffers contains
     * padding. Note that `flatcc` does not pad at the end beyond whatever
     * is stored (normally a vtable), but this is generated with `flatc
     * v1.1`.
     */
    if (flatcc_verify_ok != ns(Monster_verify_as_root_with_identifier(buffer, size, "MONS"))) {
#if FLATBUFFERS_PROTOCOL_IS_BE
        fprintf(stderr, "flatc golden reference buffer was correctly rejected by flatcc verificiation\n"
                "because flatc is little endian and flatcc has been compiled for big endian protocol format\n");
        ret = 0;
        goto done;
#else
        fprintf(stderr, "could not verify foreign monster file\n");
        ret = -1;
        goto done;
#endif
    }

#if FLATBUFFERS_PROTOCOL_IS_BE
    fprintf(stderr, "flatcc compiled with big endian protocol failed to reject reference little endian buffer\n");
    ret = -1;
    goto done;
#else
    if (flatcc_verify_ok != ns(Monster_verify_as_root(buffer, size))) {
        fprintf(stderr, "could not verify foreign monster file with default identifier\n");
        ret = -1;
        goto done;
    }
    ret = verify_monster(buffer);
#endif

done:
    aligned_free(buffer);
    return ret;
}